

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanAnchorOrAlias(Scanner *this)

{
  int iVar1;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  RegEx *pRVar5;
  ParserException *pPVar6;
  char *pcVar7;
  allocator local_b1;
  Mark local_b0;
  string name;
  undefined1 local_80 [24];
  string local_68 [8];
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined8 uStack_34;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  InsertPotentialSimpleKey(this);
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  sVar2._0_4_ = (this->INPUT).m_mark.pos;
  sVar2._4_4_ = (this->INPUT).m_mark.line;
  iVar1 = (this->INPUT).m_mark.column;
  cVar3 = YAML::Stream::get(&this->INPUT);
  while( true ) {
    bVar4 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
    if (!bVar4) break;
    pRVar5 = Exp::Anchor();
    bVar4 = RegEx::Matches(pRVar5,&this->INPUT);
    if (!bVar4) break;
    YAML::Stream::get(&this->INPUT);
    std::__cxx11::string::push_back((char)&name);
  }
  if (name._M_string_length == 0) {
    pPVar6 = (ParserException *)__cxa_allocate_exception(0x40);
    local_b0.pos = (this->INPUT).m_mark.pos;
    local_b0.line = (this->INPUT).m_mark.line;
    local_b0.column = (this->INPUT).m_mark.column;
    pcVar7 = "anchor not found after &";
    if (cVar3 == '*') {
      pcVar7 = "alias not found after *";
    }
    std::__cxx11::string::string((string *)local_80,pcVar7,&local_b1);
    ParserException::ParserException(pPVar6,&local_b0,(string *)local_80);
    __cxa_throw(pPVar6,&ParserException::typeinfo,BadConversion::~BadConversion);
  }
  bVar4 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
  if (bVar4) {
    pRVar5 = Exp::AnchorEnd();
    bVar4 = RegEx::Matches(pRVar5,&this->INPUT);
    if (!bVar4) {
      pPVar6 = (ParserException *)__cxa_allocate_exception(0x40);
      local_b0.pos = (this->INPUT).m_mark.pos;
      local_b0.line = (this->INPUT).m_mark.line;
      local_b0.column = (this->INPUT).m_mark.column;
      pcVar7 = "illegal character found while scanning anchor";
      if (cVar3 == '*') {
        pcVar7 = "illegal character found while scanning alias";
      }
      std::__cxx11::string::string((string *)local_80,pcVar7,&local_b1);
      ParserException::ParserException(pPVar6,&local_b0,(string *)local_80);
      __cxa_throw(pPVar6,&ParserException::typeinfo,BadConversion::~BadConversion);
    }
  }
  local_80._4_4_ = cVar3 == '*' | ANCHOR;
  local_80._0_4_ = VALID;
  local_68 = (string  [8])&local_58;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48 = (pointer)0x0;
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_34 = 0;
  local_80._8_8_ = sVar2;
  local_80._16_4_ = iVar1;
  std::__cxx11::string::_M_assign(local_68);
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)local_80);
  Token::~Token((Token *)local_80);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void Scanner::ScanAnchorOrAlias() {
  bool alias;
  std::string name;

  // insert a potential simple key
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  // eat the indicator
  Mark mark = INPUT.mark();
  char indicator = INPUT.get();
  alias = (indicator == Keys::Alias);

  // now eat the content
  while (INPUT && Exp::Anchor().Matches(INPUT))
    name += INPUT.get();

  // we need to have read SOMETHING!
  if (name.empty())
    throw ParserException(INPUT.mark(), alias ? ErrorMsg::ALIAS_NOT_FOUND
                                              : ErrorMsg::ANCHOR_NOT_FOUND);

  // and needs to end correctly
  if (INPUT && !Exp::AnchorEnd().Matches(INPUT))
    throw ParserException(INPUT.mark(), alias ? ErrorMsg::CHAR_IN_ALIAS
                                              : ErrorMsg::CHAR_IN_ANCHOR);

  // and we're done
  Token token(alias ? Token::ALIAS : Token::ANCHOR, mark);
  token.value = name;
  m_tokens.push(token);
}